

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle_private.hh
# Opt level: O0

QPDFObjectHandle __thiscall qpdf::Stream::getDict(Stream *this)

{
  Members *pMVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Stream *in_RSI;
  QPDFObjectHandle QVar2;
  Stream *this_local;
  
  pMVar1 = stream(in_RSI);
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,&pMVar1->stream_dict);
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
        getDict() const
        {
            return stream()->stream_dict;
        }